

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptRegExp::SetProperty
          (JavascriptRegExp *this,JavascriptString *propertyNameString,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  bool bVar1;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  BOOL local_34 [2];
  BOOL result;
  
  propertyRecord = (PropertyRecord *)info;
  ScriptContext::FindPropertyRecord
            ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_48);
  if ((local_48 == (PropertyRecord *)0x0) ||
     (bVar1 = SetPropertyBuiltIns(this,local_48->pid,value,flags,local_34), !bVar1)) {
    local_34[0] = DynamicObject::SetProperty
                            (&this->super_DynamicObject,propertyNameString,value,flags,
                             (PropertyValueInfo *)propertyRecord);
  }
  return local_34[0];
}

Assistant:

BOOL JavascriptRegExp::SetProperty(JavascriptString* propertyNameString, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        BOOL result;
        PropertyRecord const * propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr && SetPropertyBuiltIns(propertyRecord->GetPropertyId(), value, flags, &result))
        {
            return result;
        }

        return DynamicObject::SetProperty(propertyNameString, value, flags, info);
    }